

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int parse_attr_token(char *str,char *attr_name,char **val,size_t *vallen)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long *in_RCX;
  long *in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar4;
  size_t unaff_retaddr;
  void *in_stack_00000008;
  char *p;
  size_t attr_name_len;
  char *local_38;
  
  *in_RDX = 0;
  *in_RCX = 0;
  sVar2 = strlen(in_RSI);
  local_38 = strchr(in_RDI,0x3b);
  do {
    if (local_38 == (char *)0x0) {
      return 0;
    }
    do {
      local_38 = local_38 + 1;
      iVar1 = isspace((int)*local_38);
    } while (iVar1 != 0);
    iVar1 = memicmp(p,in_stack_00000008,unaff_retaddr);
    if (iVar1 == 0) {
      local_38 = local_38 + sVar2;
      while (iVar1 = isspace((int)*local_38), iVar1 != 0) {
        local_38 = local_38 + 1;
      }
      if (*local_38 == '=') {
        do {
          pcVar3 = local_38;
          local_38 = pcVar3 + 1;
          iVar1 = isspace((int)*local_38);
        } while (iVar1 != 0);
        if (*local_38 == '\"') {
          local_38 = pcVar3 + 2;
          *in_RDX = (long)local_38;
          while( true ) {
            bVar4 = false;
            if (*local_38 != '\0') {
              bVar4 = *local_38 != '\"';
            }
            if (!bVar4) break;
            local_38 = local_38 + 1;
          }
        }
        else {
          *in_RDX = (long)local_38;
          while( true ) {
            bVar4 = false;
            if (*local_38 != '\0') {
              pcVar3 = strchr(" \t;,",(int)*local_38);
              bVar4 = pcVar3 == (char *)0x0;
            }
            if (!bVar4) break;
            local_38 = local_38 + 1;
          }
        }
        *in_RCX = (long)local_38 - *in_RDX;
        return 1;
      }
    }
    local_38 = strchr(local_38,0x3b);
  } while( true );
}

Assistant:

static int parse_attr_token(const char *str, const char *attr_name,
                            const char *&val, size_t &vallen)
{
    /* assume we won't find anything */
    val = 0;
    vallen = 0;

    /* note the name length */
    size_t attr_name_len = strlen(attr_name);

    /* scan the string for attribute tokens, starting at the first ';' */
    for (const char *p = strchr(str, ';') ; p != 0 ; p = strchr(p, ';'))
    {
        /* skip spaces */
        for (++p ; isspace(*p) ; ++p) ;

        /* check to see if this is the desired attribute name */
        if (memicmp(p, attr_name, attr_name_len) != 0)
            continue;

        /* skip the name and any subsequent spaces, and look for the '=' */
        for (p += attr_name_len ; isspace(*p) ; ++p) ;
        if (*p != '=')
            continue;

        /* skip the '=' and subsequent spaces */
        for (++p ; isspace(*p) ; ++p) ;

        /* 
         *   Okay, we're at the attribute value.  If there's a quote mark,
         *   the value is everything from here to the close quote.  Otherwise
         *   it's everything up to the next space or semicolon.  
         */
        if (*p == '"')
        {
            /* skip the open quote, and find the close quote */
            for (val = ++p ; *p != '\0' && *p != '"' ; ++p) ;
        }
        else
        {
            /* it's from here to the next separator character */
            val = p;
            for ( ; *p != '\0' && strchr(" \t;,", *p) == 0 ; ++p) ;
        }

        /* note the length, and return success */
        vallen = p - val;
        return TRUE;
    }

    /* didn't find it - return failure */
    return FALSE;
}